

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O2

RPCHelpMan * wallet::listdescriptors(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string name_00;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_13;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined4 in_stack_ffffffffffffeee8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffeeec;
  undefined1 in_stack_ffffffffffffeef0 [24];
  undefined8 in_stack_ffffffffffffef08;
  undefined8 in_stack_ffffffffffffef10;
  _Manager_type in_stack_ffffffffffffef18;
  undefined8 in_stack_ffffffffffffef20;
  undefined1 in_stack_ffffffffffffef28 [16];
  pointer in_stack_ffffffffffffef38;
  pointer pRVar7;
  pointer in_stack_ffffffffffffef40;
  pointer pRVar8;
  pointer in_stack_ffffffffffffef48;
  pointer pRVar9;
  pointer in_stack_ffffffffffffef50;
  pointer in_stack_ffffffffffffef58;
  pointer pRVar10;
  pointer in_stack_ffffffffffffef60;
  pointer pRVar11;
  pointer in_stack_ffffffffffffef68;
  pointer pRVar12;
  undefined8 in_stack_ffffffffffffef70;
  pointer in_stack_ffffffffffffef78;
  pointer pRVar13;
  pointer in_stack_ffffffffffffef80;
  pointer pRVar14;
  pointer in_stack_ffffffffffffef88;
  pointer pRVar15;
  _Invoker_type in_stack_ffffffffffffef90;
  pointer in_stack_ffffffffffffef98;
  pointer in_stack_ffffffffffffefa0;
  pointer in_stack_ffffffffffffefa8;
  undefined1 in_stack_ffffffffffffefb0 [32];
  undefined8 local_1030;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1028;
  allocator<char> local_100a;
  allocator<char> local_1009;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1008;
  allocator<char> local_fea;
  allocator<char> local_fe9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_fe8;
  allocator<char> local_fca;
  allocator<char> local_fc9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_fc8;
  allocator<char> local_faa;
  allocator<char> local_fa9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_fa8;
  allocator<char> local_f8a;
  allocator<char> local_f89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_f88;
  allocator<char> local_f6a;
  allocator<char> local_f69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_f68;
  allocator<char> local_f4a;
  allocator<char> local_f49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_f48;
  allocator<char> local_f2a;
  allocator<char> local_f29;
  RPCResults local_f28;
  allocator_type local_f0c;
  allocator<char> local_f0b;
  bool local_f0a;
  allocator<char> local_f09;
  vector<RPCArg,_std::allocator<RPCArg>_> local_f08;
  allocator<char> local_eea;
  allocator<char> local_ee9;
  string local_ee8;
  string local_ec8;
  string local_ea8;
  string local_e88;
  string local_e68;
  string local_e48;
  string local_e28;
  string local_e08;
  string local_de8;
  string local_dc8;
  string local_da8;
  string local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  char *local_d08;
  size_type local_d00;
  char local_cf8 [8];
  undefined8 uStack_cf0;
  string local_ce8 [32];
  string local_cc8 [32];
  string local_ca8 [32];
  string local_c88 [32];
  string local_c68 [32];
  string local_c48 [32];
  string local_c28 [32];
  string local_c08 [32];
  RPCResult local_be8 [2];
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  RPCResult local_998 [4];
  RPCResult local_778;
  RPCResult local_6f0;
  RPCResult local_668;
  string local_5e0 [32];
  string local_5c0 [32];
  RPCResult local_5a0;
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  RPCResult local_498 [2];
  string local_388 [32];
  string local_368 [32];
  RPCResult local_348;
  RPCArgOptions local_2c0;
  string local_278 [32];
  UniValue local_258;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  string local_1a0 [32];
  RPCArg local_180;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"listdescriptors",&local_ee9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"\nList descriptors imported into a descriptor-enabled wallet.\n",&local_eea);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"private",&local_f09);
  local_f0a = false;
  UniValue::UniValue<bool,_bool,_true>(&local_258,&local_f0a);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_200,&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,"Show private descriptors.",&local_f0b);
  local_2c0.oneline_description._M_dataplus._M_p = (pointer)&local_2c0.oneline_description.field_2;
  local_2c0.skip_type_check = false;
  local_2c0.oneline_description._M_string_length = 0;
  local_2c0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_2c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_2c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_2c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_2c0._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeeec;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeee8;
  name._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffeef0._8_16_;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffef10;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffef08;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffef18;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffef20;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffef28;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffef38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffef40;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffef48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffef50;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffef58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffef60;
  description_13._M_string_length = in_stack_ffffffffffffef70;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef68;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef78;
  description_13.field_2._8_8_ = in_stack_ffffffffffffef80;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef90;
  opts._0_8_ = in_stack_ffffffffffffef88;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffef98;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffefa0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffefa8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffefb0._0_24_;
  opts.hidden = (bool)in_stack_ffffffffffffefb0[0x18];
  opts.also_positional = (bool)in_stack_ffffffffffffefb0[0x19];
  opts._66_6_ = in_stack_ffffffffffffefb0._26_6_;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_13,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_f08,__l,&local_f0c);
  std::__cxx11::string::string<std::allocator<char>>(local_368,"",&local_f29);
  std::__cxx11::string::string<std::allocator<char>>(local_388,"",&local_f2a);
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"wallet_name",&local_f49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d8,"Name of wallet this operation was performed on",&local_f4a);
  local_f68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeeec;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeee8;
  m_key_name._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeef0._8_16_;
  description._M_string_length = in_stack_ffffffffffffef10;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffef38;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult(local_498,STR,m_key_name,description,inner,SUB81(local_4b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_4f8,"descriptors",&local_f69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_518,"Array of descriptor objects (sorted by descriptor string representation)",
             &local_f6a);
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"",&local_f89);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"",&local_f8a);
  std::__cxx11::string::string<std::allocator<char>>(local_9b8,"desc",&local_fa9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9d8,"Descriptor string representation",&local_faa);
  local_fc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_fc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeeec;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeee8;
  m_key_name_00._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeef0._8_16_;
  description_00._M_string_length = in_stack_ffffffffffffef10;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_00.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef38;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult(local_998,STR,m_key_name_00,description_00,inner_00,SUB81(local_9b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_9f8,"timestamp",&local_fc9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a18,"The creation time of the descriptor",&local_fca);
  local_fe8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_fe8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fe8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeeec;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeee8;
  m_key_name_01._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  m_key_name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeef0._8_16_;
  description_01._M_string_length = in_stack_ffffffffffffef10;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_01.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef38;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult(local_998 + 1,NUM,m_key_name_01,description_01,inner_01,SUB81(local_9f8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a38,"active",&local_fe9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a58,"Whether this descriptor is currently used to generate new addresses",
             &local_fea);
  local_1008.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1008.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1008.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeeec;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeee8;
  m_key_name_02._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  m_key_name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeef0._8_16_;
  description_02._M_string_length = in_stack_ffffffffffffef10;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_02.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef38;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult(local_998 + 2,BOOL,m_key_name_02,description_02,inner_02,SUB81(local_a38,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a78,"internal",&local_1009);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a98,
             "True if this descriptor is used to generate change addresses. False if this descriptor is used to generate receiving addresses; defined only for active descriptors"
             ,&local_100a);
  local_1028.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1028.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1028.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0;
  auVar1._4_24_ = in_stack_ffffffffffffeef0;
  auVar1._0_4_ = in_stack_ffffffffffffeeec;
  auVar1._28_4_ = 0;
  description_03._M_string_length = in_stack_ffffffffffffef10;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_03.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef38;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult
            (local_998 + 3,BOOL,(string)(auVar1 << 0x20),SUB81(local_a78,0),description_03,inner_03,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ab8,"range",(allocator<char> *)((long)&local_1030 + 7));
  std::__cxx11::string::string<std::allocator<char>>
            (local_ad8,"Defined only for ranged descriptors",
             (allocator<char> *)((long)&local_1030 + 6));
  std::__cxx11::string::string<std::allocator<char>>
            (local_c08,"",(allocator<char> *)&stack0xffffffffffffefb7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c28,"Range start inclusive",(allocator<char> *)&stack0xffffffffffffefb6);
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeeec;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_03._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  m_key_name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeef0._8_16_;
  description_04._M_string_length = in_stack_ffffffffffffef10;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_04.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef38;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult(local_be8,NUM,m_key_name_03,description_04,inner_04,SUB81(local_c08,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_c48,"",(allocator<char> *)&stack0xffffffffffffef97);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c68,"Range end inclusive",(allocator<char> *)&stack0xffffffffffffef96);
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeeec;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_04._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  m_key_name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeef0._8_16_;
  description_05._M_string_length = in_stack_ffffffffffffef10;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_05.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef38;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult(local_be8 + 1,NUM,m_key_name_04,description_05,inner_05,SUB81(local_c48,0));
  __l_00._M_len = 2;
  __l_00._M_array = local_be8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffefb8,__l_00,
             (allocator_type *)&stack0xffffffffffffef77);
  auVar2._4_24_ = in_stack_ffffffffffffeef0;
  auVar2._0_4_ = in_stack_ffffffffffffeeec;
  auVar2._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffef10;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_06.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef38;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult
            (&local_778,ARR_FIXED,(string)(auVar2 << 0x20),SUB81(local_ab8,0),description_06,
             inner_06,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c88,"next",(allocator<char> *)&stack0xffffffffffffef76);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ca8,"Same as next_index field. Kept for compatibility reason.",
             (allocator<char> *)&stack0xffffffffffffef75);
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  auVar3._4_24_ = in_stack_ffffffffffffeef0;
  auVar3._0_4_ = in_stack_ffffffffffffeeec;
  auVar3._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffef10;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_07.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef38;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult
            (&local_6f0,NUM,(string)(auVar3 << 0x20),SUB81(local_c88,0),description_07,inner_07,true
            );
  std::__cxx11::string::string<std::allocator<char>>
            (local_cc8,"next_index",(allocator<char> *)&stack0xffffffffffffef57);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ce8,
             "The next index to generate addresses from; defined only for ranged descriptors",
             (allocator<char> *)&stack0xffffffffffffef56);
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  uVar6 = 0;
  auVar4._4_24_ = in_stack_ffffffffffffeef0;
  auVar4._0_4_ = in_stack_ffffffffffffeeec;
  auVar4._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffef10;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_08.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult
            (&local_668,NUM,(string)(auVar4 << 0x20),SUB81(local_cc8,0),description_08,inner_08,true
            );
  __l_01._M_len = 7;
  __l_01._M_array = local_998;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_fa8,__l_01,(allocator_type *)&stack0xffffffffffffef37);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeeec;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_05._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  m_key_name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeef0._8_16_;
  description_09._M_string_length = in_stack_ffffffffffffef10;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_09.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult(&local_5a0,OBJ,m_key_name_05,description_09,inner_09,SUB81(local_5c0,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_5a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_f88,__l_02,(allocator_type *)&stack0xffffffffffffef36);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeeec;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_06._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  m_key_name_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeef0._8_16_;
  description_10._M_string_length = in_stack_ffffffffffffef10;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_10.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult(local_498 + 1,ARR,m_key_name_06,description_10,inner_10,SUB81(local_4f8,0));
  __l_03._M_len = 2;
  __l_03._M_array = local_498;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_f48,__l_03,(allocator_type *)&stack0xffffffffffffef35);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeeec;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_07._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  m_key_name_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeef0._8_16_;
  description_11._M_string_length = in_stack_ffffffffffffef10;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef08;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffef18;
  description_11.field_2._8_8_ = in_stack_ffffffffffffef20;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef28._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef28._8_8_;
  RPCResult::RPCResult(&local_348,OBJ,m_key_name_07,description_11,inner_11,SUB81(local_368,0));
  result._4_4_ = in_stack_ffffffffffffeeec;
  result.m_type = uVar6;
  result.m_key_name._0_24_ = in_stack_ffffffffffffeef0;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffef08;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef10;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef18;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef20;
  result.m_optional = (bool)in_stack_ffffffffffffef28[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffef28[1];
  result._66_6_ = in_stack_ffffffffffffef28._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef28._8_8_;
  result.m_description._M_string_length = (size_type)pRVar7;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar8;
  result.m_description.field_2._8_8_ = pRVar9;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef50;
  result.m_cond._M_string_length = (size_type)pRVar10;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar11;
  result.m_cond.field_2._8_8_ = pRVar12;
  RPCResults::RPCResults(&local_f28,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_da8,"listdescriptors",(allocator<char> *)&stack0xffffffffffffef34);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dc8,"",(allocator<char> *)&stack0xffffffffffffef33);
  HelpExampleCli(&local_d88,&local_da8,&local_dc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e08,"listdescriptors",(allocator<char> *)&stack0xffffffffffffef32);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e28,"",(allocator<char> *)&stack0xffffffffffffef31);
  HelpExampleRpc(&local_de8,&local_e08,&local_e28);
  std::operator+(&local_d68,&local_d88,&local_de8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e68,"listdescriptors",(allocator<char> *)&stack0xffffffffffffef30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e88,"true",(allocator<char> *)&stack0xffffffffffffef2f);
  HelpExampleCli(&local_e48,&local_e68,&local_e88);
  std::operator+(&local_d48,&local_d68,&local_e48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ec8,"listdescriptors",(allocator<char> *)&stack0xffffffffffffef2e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ee8,"true",(allocator<char> *)&stack0xffffffffffffef2d);
  HelpExampleRpc(&local_ea8,&local_ec8,&local_ee8);
  std::operator+(&local_d28,&local_d48,&local_ea8);
  local_d08 = local_cf8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28._M_dataplus._M_p == &local_d28.field_2) {
    uStack_cf0 = local_d28.field_2._8_8_;
  }
  else {
    local_d08 = local_d28._M_dataplus._M_p;
  }
  local_d00 = local_d28._M_string_length;
  local_d28._M_string_length = 0;
  local_d28.field_2._M_local_buf[0] = '\0';
  name_00._M_string_length = in_stack_ffffffffffffeef0._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffeef0._8_16_;
  name_00._M_dataplus._M_p = &stack0xffffffffffffef08;
  description_12.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/backup.cpp:1803:9)>
       ::_M_manager;
  description_12._M_dataplus._M_p = (pointer)0x0;
  description_12._M_string_length = 0;
  description_12.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/backup.cpp:1803:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar7;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffef28._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffef28._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar9;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffef50;
  examples.m_examples._M_string_length = (size_type)pRVar11;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar10;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar12;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffef70;
  fun.super__Function_base._M_functor._8_8_ = pRVar14;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar13;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar15;
  fun._M_invoker = in_stack_ffffffffffffef90;
  local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
  RPCHelpMan::RPCHelpMan(in_RDI,name_00,description_12,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffef08);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_ea8);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::__cxx11::string::~string((string *)&local_ec8);
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::~string((string *)&local_e48);
  std::__cxx11::string::~string((string *)&local_e88);
  std::__cxx11::string::~string((string *)&local_e68);
  std::__cxx11::string::~string((string *)&local_d68);
  std::__cxx11::string::~string((string *)&local_de8);
  std::__cxx11::string::~string((string *)&local_e28);
  std::__cxx11::string::~string((string *)&local_e08);
  std::__cxx11::string::~string((string *)&local_d88);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::__cxx11::string::~string((string *)&local_da8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f28.m_results);
  RPCResult::~RPCResult(&local_348);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f48);
  lVar5 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_498[0].m_type + lVar5));
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f88);
  RPCResult::~RPCResult(&local_5a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_fa8);
  lVar5 = 0x330;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_998[0].m_type + lVar5));
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffef38);
  std::__cxx11::string::~string(local_ce8);
  std::__cxx11::string::~string(local_cc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffef58);
  std::__cxx11::string::~string(local_ca8);
  std::__cxx11::string::~string(local_c88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffefb8);
  lVar5 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_be8[0].m_type + lVar5));
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffef78);
  std::__cxx11::string::~string(local_c68);
  std::__cxx11::string::~string(local_c48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffef98);
  std::__cxx11::string::~string(local_c28);
  std::__cxx11::string::~string(local_c08);
  std::__cxx11::string::~string(local_ad8);
  std::__cxx11::string::~string(local_ab8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1028);
  std::__cxx11::string::~string(local_a98);
  std::__cxx11::string::~string(local_a78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1008);
  std::__cxx11::string::~string(local_a58);
  std::__cxx11::string::~string(local_a38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_fe8);
  std::__cxx11::string::~string(local_a18);
  std::__cxx11::string::~string(local_9f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_fc8);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_9b8);
  std::__cxx11::string::~string(local_5e0);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_4f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f68);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_4b8);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_368);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_f08);
  RPCArg::~RPCArg(&local_180);
  RPCArgOptions::~RPCArgOptions(&local_2c0);
  std::__cxx11::string::~string(local_278);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_200);
  UniValue::~UniValue(&local_258);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listdescriptors()
{
    return RPCHelpMan{
        "listdescriptors",
        "\nList descriptors imported into a descriptor-enabled wallet.\n",
        {
            {"private", RPCArg::Type::BOOL, RPCArg::Default{false}, "Show private descriptors."}
        },
        RPCResult{RPCResult::Type::OBJ, "", "", {
            {RPCResult::Type::STR, "wallet_name", "Name of wallet this operation was performed on"},
            {RPCResult::Type::ARR, "descriptors", "Array of descriptor objects (sorted by descriptor string representation)",
            {
                {RPCResult::Type::OBJ, "", "", {
                    {RPCResult::Type::STR, "desc", "Descriptor string representation"},
                    {RPCResult::Type::NUM, "timestamp", "The creation time of the descriptor"},
                    {RPCResult::Type::BOOL, "active", "Whether this descriptor is currently used to generate new addresses"},
                    {RPCResult::Type::BOOL, "internal", /*optional=*/true, "True if this descriptor is used to generate change addresses. False if this descriptor is used to generate receiving addresses; defined only for active descriptors"},
                    {RPCResult::Type::ARR_FIXED, "range", /*optional=*/true, "Defined only for ranged descriptors", {
                        {RPCResult::Type::NUM, "", "Range start inclusive"},
                        {RPCResult::Type::NUM, "", "Range end inclusive"},
                    }},
                    {RPCResult::Type::NUM, "next", /*optional=*/true, "Same as next_index field. Kept for compatibility reason."},
                    {RPCResult::Type::NUM, "next_index", /*optional=*/true, "The next index to generate addresses from; defined only for ranged descriptors"},
                }},
            }}
        }},
        RPCExamples{
            HelpExampleCli("listdescriptors", "") + HelpExampleRpc("listdescriptors", "")
            + HelpExampleCli("listdescriptors", "true") + HelpExampleRpc("listdescriptors", "true")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> wallet = GetWalletForJSONRPCRequest(request);
    if (!wallet) return UniValue::VNULL;

    if (!wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "listdescriptors is not available for non-descriptor wallets");
    }

    const bool priv = !request.params[0].isNull() && request.params[0].get_bool();
    if (priv) {
        EnsureWalletIsUnlocked(*wallet);
    }

    LOCK(wallet->cs_wallet);

    const auto active_spk_mans = wallet->GetActiveScriptPubKeyMans();

    struct WalletDescInfo {
        std::string descriptor;
        uint64_t creation_time;
        bool active;
        std::optional<bool> internal;
        std::optional<std::pair<int64_t,int64_t>> range;
        int64_t next_index;
    };

    std::vector<WalletDescInfo> wallet_descriptors;
    for (const auto& spk_man : wallet->GetAllScriptPubKeyMans()) {
        const auto desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man);
        if (!desc_spk_man) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Unexpected ScriptPubKey manager type.");
        }
        LOCK(desc_spk_man->cs_desc_man);
        const auto& wallet_descriptor = desc_spk_man->GetWalletDescriptor();
        std::string descriptor;
        if (!desc_spk_man->GetDescriptorString(descriptor, priv)) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Can't get descriptor string.");
        }
        const bool is_range = wallet_descriptor.descriptor->IsRange();
        wallet_descriptors.push_back({
            descriptor,
            wallet_descriptor.creation_time,
            active_spk_mans.count(desc_spk_man) != 0,
            wallet->IsInternalScriptPubKeyMan(desc_spk_man),
            is_range ? std::optional(std::make_pair(wallet_descriptor.range_start, wallet_descriptor.range_end)) : std::nullopt,
            wallet_descriptor.next_index
        });
    }

    std::sort(wallet_descriptors.begin(), wallet_descriptors.end(), [](const auto& a, const auto& b) {
        return a.descriptor < b.descriptor;
    });

    UniValue descriptors(UniValue::VARR);
    for (const WalletDescInfo& info : wallet_descriptors) {
        UniValue spk(UniValue::VOBJ);
        spk.pushKV("desc", info.descriptor);
        spk.pushKV("timestamp", info.creation_time);
        spk.pushKV("active", info.active);
        if (info.internal.has_value()) {
            spk.pushKV("internal", info.internal.value());
        }
        if (info.range.has_value()) {
            UniValue range(UniValue::VARR);
            range.push_back(info.range->first);
            range.push_back(info.range->second - 1);
            spk.pushKV("range", std::move(range));
            spk.pushKV("next", info.next_index);
            spk.pushKV("next_index", info.next_index);
        }
        descriptors.push_back(std::move(spk));
    }

    UniValue response(UniValue::VOBJ);
    response.pushKV("wallet_name", wallet->GetName());
    response.pushKV("descriptors", std::move(descriptors));

    return response;
},
    };
}